

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O2

MipLevelProperties *
Diligent::GetMipLevelProperties
          (MipLevelProperties *__return_storage_ptr__,TextureDesc *TexDesc,Uint32 MipLevel)

{
  RESOURCE_DIMENSION RVar1;
  type tVar2;
  type tVar3;
  TextureFormatAttribs *pTVar4;
  byte bVar5;
  uint uVar6;
  Uint64 UVar7;
  Uint32 UVar8;
  uint uVar9;
  uint uVar10;
  string msg;
  
  __return_storage_ptr__->StorageWidth = 0;
  __return_storage_ptr__->StorageHeight = 0;
  __return_storage_ptr__->RowSize = 0;
  __return_storage_ptr__->DepthSliceSize = 0;
  __return_storage_ptr__->MipSize = 0;
  pTVar4 = GetTextureFormatAttribs(TexDesc->Format);
  bVar5 = (byte)MipLevel;
  uVar10 = TexDesc->Width >> (bVar5 & 0x1f);
  UVar8 = 1;
  uVar10 = uVar10 + (uVar10 == 0);
  __return_storage_ptr__->LogicalWidth = uVar10;
  RVar1 = TexDesc->Type;
  uVar6 = UVar8;
  if ((RVar1 & ~RESOURCE_DIM_BUFFER) != RESOURCE_DIM_TEX_1D) {
    uVar6 = TexDesc->Height;
  }
  uVar6 = uVar6 >> (bVar5 & 0x1f);
  uVar6 = uVar6 + (uVar6 == 0);
  __return_storage_ptr__->LogicalHeight = uVar6;
  if (RVar1 == RESOURCE_DIM_TEX_3D) {
    UVar8 = (TexDesc->field_3).ArraySize;
  }
  uVar9 = UVar8 >> (bVar5 & 0x1f);
  uVar9 = uVar9 + (uVar9 == 0);
  __return_storage_ptr__->Depth = uVar9;
  if (pTVar4->ComponentType == COMPONENT_TYPE_COMPRESSED) {
    bVar5 = pTVar4->BlockWidth;
    if ((bVar5 < 2) || (pTVar4->BlockHeight < 2)) {
      FormatString<char[26],char[56]>
                (&msg,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"FmtAttribs.BlockWidth > 1 && FmtAttribs.BlockHeight > 1",
                 (char (*) [56])(ulong)MipLevel);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"GetMipLevelProperties",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                 ,0x814);
      std::__cxx11::string::~string((string *)&msg);
      bVar5 = pTVar4->BlockWidth;
    }
    if ((bVar5 & bVar5 - 1) != 0) {
      FormatString<char[52]>
                (&msg,(char (*) [52])"Compressed block width is expected to be power of 2");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"GetMipLevelProperties",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                 ,0x815);
      std::__cxx11::string::~string((string *)&msg);
    }
    if ((pTVar4->BlockHeight & pTVar4->BlockHeight - 1) != 0) {
      FormatString<char[53]>
                (&msg,(char (*) [53])"Compressed block height is expected to be power of 2");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"GetMipLevelProperties",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                 ,0x816);
      std::__cxx11::string::~string((string *)&msg);
    }
    tVar2 = AlignUp<unsigned_int,unsigned_int>(uVar10,(uint)pTVar4->BlockWidth);
    __return_storage_ptr__->StorageWidth = tVar2;
    tVar3 = AlignUp<unsigned_int,unsigned_int>(uVar6,(uint)pTVar4->BlockHeight);
    __return_storage_ptr__->StorageHeight = tVar3;
    UVar7 = (ulong)pTVar4->ComponentSize * ((ulong)tVar2 / (ulong)pTVar4->BlockWidth);
    __return_storage_ptr__->RowSize = UVar7;
    uVar6 = tVar3 / pTVar4->BlockHeight;
  }
  else {
    __return_storage_ptr__->StorageWidth = uVar10;
    __return_storage_ptr__->StorageHeight = uVar6;
    UVar7 = (ulong)pTVar4->NumComponents * (ulong)pTVar4->ComponentSize * (ulong)uVar10;
    __return_storage_ptr__->RowSize = UVar7;
  }
  __return_storage_ptr__->DepthSliceSize = uVar6 * UVar7;
  __return_storage_ptr__->MipSize = (ulong)uVar9 * uVar6 * UVar7;
  return __return_storage_ptr__;
}

Assistant:

MipLevelProperties GetMipLevelProperties(const TextureDesc& TexDesc, Uint32 MipLevel)
{
    MipLevelProperties          MipProps;
    const TextureFormatAttribs& FmtAttribs = GetTextureFormatAttribs(TexDesc.Format);

    MipProps.LogicalWidth  = std::max(TexDesc.GetWidth() >> MipLevel, 1u);
    MipProps.LogicalHeight = std::max(TexDesc.GetHeight() >> MipLevel, 1u);
    MipProps.Depth         = std::max(TexDesc.GetDepth() >> MipLevel, 1u);
    if (FmtAttribs.ComponentType == COMPONENT_TYPE_COMPRESSED)
    {
        VERIFY_EXPR(FmtAttribs.BlockWidth > 1 && FmtAttribs.BlockHeight > 1);
        VERIFY((FmtAttribs.BlockWidth & (FmtAttribs.BlockWidth - 1)) == 0, "Compressed block width is expected to be power of 2");
        VERIFY((FmtAttribs.BlockHeight & (FmtAttribs.BlockHeight - 1)) == 0, "Compressed block height is expected to be power of 2");
        // For block-compression formats, all parameters are still specified in texels rather than compressed texel blocks (18.4.1)
        MipProps.StorageWidth   = AlignUp(MipProps.LogicalWidth, Uint32{FmtAttribs.BlockWidth});
        MipProps.StorageHeight  = AlignUp(MipProps.LogicalHeight, Uint32{FmtAttribs.BlockHeight});
        MipProps.RowSize        = Uint64{MipProps.StorageWidth} / Uint32{FmtAttribs.BlockWidth} * Uint32{FmtAttribs.ComponentSize}; // ComponentSize is the block size
        MipProps.DepthSliceSize = MipProps.StorageHeight / Uint32{FmtAttribs.BlockHeight} * MipProps.RowSize;
        MipProps.MipSize        = MipProps.DepthSliceSize * MipProps.Depth;
    }
    else
    {
        MipProps.StorageWidth   = MipProps.LogicalWidth;
        MipProps.StorageHeight  = MipProps.LogicalHeight;
        MipProps.RowSize        = Uint64{MipProps.StorageWidth} * Uint32{FmtAttribs.ComponentSize} * Uint32{FmtAttribs.NumComponents};
        MipProps.DepthSliceSize = MipProps.RowSize * MipProps.StorageHeight;
        MipProps.MipSize        = MipProps.DepthSliceSize * MipProps.Depth;
    }

    return MipProps;
}